

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void llvm::cl::PrintHelpMessage(bool Hidden,bool Categorized)

{
  bool Categorized_local;
  bool Hidden_local;
  
  if ((Hidden) || (Categorized)) {
    if ((Hidden) || (!Categorized)) {
      if ((!Hidden) || (Categorized)) {
        anon_unknown.dwarf_f773b::HelpPrinter::printHelp
                  (&CategorizedHiddenPrinter.super_HelpPrinter);
      }
      else {
        anon_unknown.dwarf_f773b::HelpPrinter::printHelp(&UncategorizedHiddenPrinter);
      }
    }
    else {
      anon_unknown.dwarf_f773b::HelpPrinter::printHelp(&CategorizedNormalPrinter.super_HelpPrinter);
    }
  }
  else {
    anon_unknown.dwarf_f773b::HelpPrinter::printHelp(&UncategorizedNormalPrinter);
  }
  return;
}

Assistant:

void cl::PrintHelpMessage(bool Hidden, bool Categorized) {
  if (!Hidden && !Categorized)
    UncategorizedNormalPrinter.printHelp();
  else if (!Hidden && Categorized)
    CategorizedNormalPrinter.printHelp();
  else if (Hidden && !Categorized)
    UncategorizedHiddenPrinter.printHelp();
  else
    CategorizedHiddenPrinter.printHelp();
}